

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopFusion::UsedInContinueOrConditionBlock
          (LoopFusion *this,Instruction *phi_instruction,Loop *loop)

{
  Instruction *pIVar1;
  IRContext *this_00;
  bool bVar2;
  uint32_t uVar3;
  BasicBlock *pBVar4;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pBVar4 = Loop::FindConditionBlock(loop);
  pIVar1 = (pBVar4->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_48._12_4_ = 0;
  uVar3 = 0;
  if (pIVar1->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
  }
  pIVar1 = (loop->loop_continue_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar1->has_result_id_ == true) {
    local_48._12_4_ = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
  }
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:89:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:89:7)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  local_48._8_4_ = uVar3;
  bVar2 = analysis::DefUseManager::WhileEachUser
                    ((this_00->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,phi_instruction,
                     (function<bool_(spvtools::opt::Instruction_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return !bVar2;
}

Assistant:

bool LoopFusion::UsedInContinueOrConditionBlock(Instruction* phi_instruction,
                                                Loop* loop) {
  auto condition_block = loop->FindConditionBlock()->id();
  auto continue_block = loop->GetContinueBlock()->id();
  auto not_used = context_->get_def_use_mgr()->WhileEachUser(
      phi_instruction,
      [this, condition_block, continue_block](Instruction* instruction) {
        auto block_id = context_->get_instr_block(instruction)->id();
        return block_id != condition_block && block_id != continue_block;
      });

  return !not_used;
}